

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedbuffer_test.cpp
# Opt level: O0

int main(void)

{
  int local_41c;
  undefined1 local_418 [4];
  int i;
  FixedBuffer<1024UL> buffer;
  
  buffer.m_pos._4_4_ = 0;
  FixedBuffer<1024UL>::FixedBuffer((FixedBuffer<1024UL> *)local_418);
  for (local_41c = 0; local_41c < 10; local_41c = local_41c + 1) {
    FixedBuffer<1024UL>::Append((FixedBuffer<1024UL> *)local_418,"xiaocai",7);
  }
  printBufferInfo<1024ul>((FixedBuffer<1024UL> *)local_418);
  FixedBuffer<1024UL>::Reset((FixedBuffer<1024UL> *)local_418);
  FixedBuffer<1024UL>::Append((FixedBuffer<1024UL> *)local_418,"xiaofan",7);
  printBufferInfo<1024ul>((FixedBuffer<1024UL> *)local_418);
  return buffer.m_pos._4_4_;
}

Assistant:

int main()
{
	FixedBuffer<1024> buffer;
	for (int i = 0; i < 10; ++i)
	{
		buffer.Append("xiaocai", 7);
	}
	printBufferInfo(buffer);
	
	buffer.Reset();
	buffer.Append("xiaofan", 7);
	printBufferInfo(buffer);
}